

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow.cpp
# Opt level: O2

bool CheckProofOfWork(uint256 hash,uint nBits,Params *params)

{
  bool bVar1;
  long in_FS_OFFSET;
  arith_uint256 bnTarget;
  bool local_6a;
  bool local_69;
  base_uint<256U> local_68;
  base_uint<256U> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint<256U>::base_uint(&local_48);
  arith_uint256::SetCompact((arith_uint256 *)&local_48,nBits,&local_69,&local_6a);
  if (local_69 == false) {
    bVar1 = base_uint<256U>::EqualTo(&local_48,0);
    if ((!bVar1) && (local_6a == false)) {
      UintToArith256((arith_uint256 *)&local_68,&params->powLimit);
      bVar1 = operator>(&local_48,&local_68);
      if (!bVar1) {
        UintToArith256((arith_uint256 *)&local_68,&hash);
        bVar1 = operator>(&local_68,&local_48);
        bVar1 = !bVar1;
        goto LAB_0025abe2;
      }
    }
  }
  bVar1 = false;
LAB_0025abe2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckProofOfWork(uint256 hash, unsigned int nBits, const Consensus::Params& params)
{
    bool fNegative;
    bool fOverflow;
    arith_uint256 bnTarget;

    bnTarget.SetCompact(nBits, &fNegative, &fOverflow);

    // Check range
    if (fNegative || bnTarget == 0 || fOverflow || bnTarget > UintToArith256(params.powLimit))
        return false;

    // Check proof of work matches claimed amount
    if (UintToArith256(hash) > bnTarget)
        return false;

    return true;
}